

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::AddFieldInfo::Deserialize(AddFieldInfo *this,Deserializer *deserializer)

{
  AddFieldInfo *this_00;
  pointer pAVar1;
  pointer *__ptr;
  ColumnDefinition new_field;
  _Head_base<0UL,_duckdb::AddFieldInfo_*,_false> local_1d8;
  ColumnDefinition local_1d0;
  ColumnDefinition local_f8;
  
  Deserializer::ReadProperty<duckdb::ColumnDefinition>(&local_1d0,deserializer,400,"new_field");
  this_00 = (AddFieldInfo *)operator_new(0x170);
  ColumnDefinition::ColumnDefinition(&local_f8,&local_1d0);
  AddFieldInfo(this_00,&local_f8);
  local_1d8._M_head_impl = this_00;
  ColumnDefinition::~ColumnDefinition(&local_f8);
  pAVar1 = unique_ptr<duckdb::AddFieldInfo,_std::default_delete<duckdb::AddFieldInfo>,_true>::
           operator->((unique_ptr<duckdb::AddFieldInfo,_std::default_delete<duckdb::AddFieldInfo>,_true>
                       *)&local_1d8);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0x191,"if_field_not_exists",&pAVar1->if_field_not_exists);
  pAVar1 = unique_ptr<duckdb::AddFieldInfo,_std::default_delete<duckdb::AddFieldInfo>,_true>::
           operator->((unique_ptr<duckdb::AddFieldInfo,_std::default_delete<duckdb::AddFieldInfo>,_true>
                       *)&local_1d8);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0x192,"column_path",&pAVar1->column_path);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_1d8._M_head_impl;
  ColumnDefinition::~ColumnDefinition(&local_1d0);
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> AddFieldInfo::Deserialize(Deserializer &deserializer) {
	auto new_field = deserializer.ReadProperty<ColumnDefinition>(400, "new_field");
	auto result = duckdb::unique_ptr<AddFieldInfo>(new AddFieldInfo(std::move(new_field)));
	deserializer.ReadPropertyWithDefault<bool>(401, "if_field_not_exists", result->if_field_not_exists);
	deserializer.ReadPropertyWithDefault<vector<string>>(402, "column_path", result->column_path);
	return std::move(result);
}